

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::BuiltinVariableShader
          (BuiltinVariableShader *this,ContextType *contextType,VariableTest test)

{
  GeometryShaderOutputType outputType_;
  ShaderProgramDeclaration *pSVar1;
  char *__s;
  string local_2c8;
  GeometrySource local_2a8;
  GeometryShaderDeclaration local_288;
  string local_270;
  FragmentSource local_250;
  string local_230;
  VertexSource local_210;
  FragmentOutput local_1f0;
  GeometryToFragmentVarying local_1ec;
  VertexToGeometryVarying local_1e4;
  allocator<char> local_1d9;
  string local_1d8;
  VertexAttribute local_1b8;
  allocator<char> local_179;
  string local_178;
  VertexAttribute local_158;
  ShaderProgramDeclaration local_130;
  VariableTest local_1c;
  ContextType *pCStack_18;
  VariableTest test_local;
  ContextType *contextType_local;
  BuiltinVariableShader *this_local;
  
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bda48;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bda80;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bda98;
  local_1c = test;
  pCStack_18 = contextType;
  contextType_local = (ContextType *)this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"a_position",&local_179);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_158,&local_178,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_130,&local_158);
  __s = getTestAttributeName(local_1c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,__s,&local_1d9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b8,&local_1d8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b8);
  sglr::pdec::VertexToGeometryVarying::VertexToGeometryVarying(&local_1e4,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e4);
  sglr::pdec::GeometryToFragmentVarying::GeometryToFragmentVarying
            (&local_1ec,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1ec);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1f0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f0);
  Functional::(anonymous_namespace)::BuiltinVariableShader::genVertexSource_abi_cxx11_
            (&local_230,(BuiltinVariableShader *)this,pCStack_18,local_1c);
  sglr::pdec::VertexSource::VertexSource(&local_210,&local_230);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_210);
  Functional::(anonymous_namespace)::BuiltinVariableShader::genFragmentSource_abi_cxx11_
            (&local_270,(BuiltinVariableShader *)this,pCStack_18,local_1c);
  sglr::pdec::FragmentSource::FragmentSource(&local_250,&local_270);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_250);
  outputType_ = (uint)(local_1c != TEST_POINT_SIZE) * 2;
  sglr::pdec::GeometryShaderDeclaration::GeometryShaderDeclaration
            (&local_288,GEOMETRYSHADERINPUTTYPE_POINTS,outputType_,(ulong)outputType_ + 1,1);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_288);
  Functional::(anonymous_namespace)::BuiltinVariableShader::genGeometrySource_abi_cxx11_
            (&local_2c8,(BuiltinVariableShader *)this,pCStack_18,local_1c);
  sglr::pdec::GeometrySource::GeometrySource(&local_2a8,&local_2c8);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2a8);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::GeometrySource::~GeometrySource(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  sglr::pdec::FragmentSource::~FragmentSource(&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  sglr::pdec::VertexSource::~VertexSource(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bda48;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bda80;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bda98;
  *(VariableTest *)&(this->super_ShaderProgram).field_0x154 = local_1c;
  return;
}

Assistant:

BuiltinVariableShader::BuiltinVariableShader (const glu::ContextType& contextType, VariableTest test)
	: sglr::ShaderProgram	(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute(getTestAttributeName(test), rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(genVertexSource(contextType, test))
							<< sglr::pdec::FragmentSource(genFragmentSource(contextType, test))
							<< sglr::pdec::GeometryShaderDeclaration(rr::GEOMETRYSHADERINPUTTYPE_POINTS,
																	 ((test == TEST_POINT_SIZE) ? (rr::GEOMETRYSHADEROUTPUTTYPE_POINTS) : (rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP)),
																	 ((test == TEST_POINT_SIZE) ? (1) : (3)))
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, test)))
	, m_test				(test)
{
}